

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall spv::Builder::makeReturn(Builder *this,bool implicit,Id retVal)

{
  Block *pBVar1;
  Instruction *pIVar2;
  pointer *__ptr;
  Instruction *__args;
  Instruction *raw_instruction;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  Instruction *local_30;
  Id local_24;
  
  __args = (Instruction *)&local_38;
  if (retVal == 0) {
    pBVar1 = this->buildPoint;
    pIVar2 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    pIVar2->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar2->resultId = 0;
    pIVar2->typeId = 0;
    pIVar2->opCode = OpReturn;
    (pIVar2->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar2->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar2->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar2->block = (Block *)0x0;
    local_38._M_head_impl = pIVar2;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar1->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
    pIVar2->block = pBVar1;
    if (pIVar2->resultId != 0) {
      Module::mapInstruction(pBVar1->parent->parent,pIVar2);
      __args = pIVar2;
    }
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    local_38._M_head_impl = (Instruction *)0x0;
  }
  else {
    pIVar2 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    pIVar2->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar2->resultId = 0;
    pIVar2->typeId = 0;
    pIVar2->opCode = OpReturnValue;
    (pIVar2->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar2->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar2->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar2->block = (Block *)0x0;
    local_24 = retVal;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar2->operands,(iterator)0x0,&stack0xffffffffffffffdc);
    pBVar1 = this->buildPoint;
    __args = (Instruction *)&stack0xffffffffffffffd0;
    local_30 = pIVar2;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar1->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)__args);
    pIVar2->block = pBVar1;
    if (pIVar2->resultId != 0) {
      Module::mapInstruction(pBVar1->parent->parent,pIVar2);
      __args = pIVar2;
    }
    if (local_30 != (Instruction *)0x0) {
      (*local_30->_vptr_Instruction[1])();
    }
    local_30 = (Instruction *)0x0;
  }
  if (!implicit) {
    createAndSetNoPredecessorBlock(this,(char *)__args);
  }
  return;
}

Assistant:

void Builder::makeReturn(bool implicit, Id retVal)
{
    if (retVal) {
        Instruction* inst = new Instruction(NoResult, NoType, OpReturnValue);
        inst->addIdOperand(retVal);
        buildPoint->addInstruction(std::unique_ptr<Instruction>(inst));
    } else
        buildPoint->addInstruction(std::unique_ptr<Instruction>(new Instruction(NoResult, NoType, OpReturn)));

    if (! implicit)
        createAndSetNoPredecessorBlock("post-return");
}